

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSampleLocationEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSampleLocationEXT>
          (Impl *this,VkSampleLocationEXT *src,size_t count,ScratchAllocator *alloc)

{
  VkSampleLocationEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSampleLocationEXT>(alloc,count);
    if (pVVar1 != (VkSampleLocationEXT *)0x0) {
      pVVar1 = (VkSampleLocationEXT *)memmove(pVVar1,src,count << 3);
      return pVVar1;
    }
  }
  return (VkSampleLocationEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}